

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O3

type_of_iterator * __thiscall
roaring::Roaring64MapSetBitBiDirectionalIterator::operator--
          (type_of_iterator *__return_storage_ptr__,Roaring64MapSetBitBiDirectionalIterator *this,
          int param_1)

{
  _Rb_tree_node_base *p_Var1;
  map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  *pmVar2;
  roaring_bitmap_t *prVar3;
  container_s *pcVar4;
  bool bVar5;
  undefined3 uVar6;
  int32_t iVar7;
  uint32_t uVar8;
  roaring_container_iterator_t rVar9;
  _Base_ptr p_Var10;
  
  bVar5 = (this->i).has_value;
  uVar6 = *(undefined3 *)&(this->i).field_0x25;
  (__return_storage_ptr__->i).current_value = (this->i).current_value;
  (__return_storage_ptr__->i).has_value = bVar5;
  *(undefined3 *)&(__return_storage_ptr__->i).field_0x25 = uVar6;
  pmVar2 = this->p;
  p_Var10 = (this->map_iter)._M_node;
  prVar3 = (this->i).parent;
  pcVar4 = (this->i).container;
  uVar6 = *(undefined3 *)&(this->i).field_0x11;
  iVar7 = (this->i).container_index;
  uVar8 = (this->i).highbits;
  rVar9.index = (this->i).container_it.index;
  (__return_storage_ptr__->i).typecode = (this->i).typecode;
  *(undefined3 *)&(__return_storage_ptr__->i).field_0x11 = uVar6;
  (__return_storage_ptr__->i).container_index = iVar7;
  (__return_storage_ptr__->i).highbits = uVar8;
  (__return_storage_ptr__->i).container_it = (roaring_container_iterator_t)rVar9.index;
  (__return_storage_ptr__->i).parent = prVar3;
  (__return_storage_ptr__->i).container = pcVar4;
  __return_storage_ptr__->p = pmVar2;
  (__return_storage_ptr__->map_iter)._M_node = p_Var10;
  p_Var1 = (this->map_iter)._M_node;
  if ((_Rb_tree_header *)p_Var1 == &(this->p->_M_t)._M_impl.super__Rb_tree_header) {
    p_Var10 = (_Base_ptr)std::_Rb_tree_decrement(p_Var1);
    (this->map_iter)._M_node = p_Var10;
    roaring_iterator_init_last
              ((roaring_bitmap_t *)&p_Var10[1]._M_parent,(roaring_uint32_iterator_t *)&this->i);
  }
  else {
    roaring_uint32_iterator_previous((roaring_uint32_iterator_t *)&this->i);
    if ((this->i).has_value == false) {
      do {
        p_Var1 = (this->map_iter)._M_node;
        if (p_Var1 == (this->p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
          return __return_storage_ptr__;
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_decrement(p_Var1);
        (this->map_iter)._M_node = p_Var10;
        roaring_iterator_init_last
                  ((roaring_bitmap_t *)&p_Var10[1]._M_parent,(roaring_uint32_iterator_t *)&this->i);
      } while ((this->i).has_value != true);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

type_of_iterator operator--(int) {  // i--, must return orig. value
        Roaring64MapSetBitBiDirectionalIterator orig(*this);
        if (map_iter == p->cend()) {
            --map_iter;
            roaring_iterator_init_last(&map_iter->second.roaring, &i);
            return orig;
        }

        roaring_uint32_iterator_previous(&i);
        while (!i.has_value) {
            if (map_iter == p->cbegin()) return orig;
            map_iter--;
            roaring_iterator_init_last(&map_iter->second.roaring, &i);
        }
        return orig;
    }